

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<signed_char,unsigned_int,7>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,uint *rhs,char *result)

{
  code *pcVar1;
  char cVar2;
  long lVar3;
  undefined1 *in_RDX;
  uint *in_RSI;
  char *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI + (ulong)*in_RSI;
  if (SCARRY8((long)*in_RDI,(ulong)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  cVar2 = std::numeric_limits<signed_char>::max();
  if (lVar3 <= cVar2) {
    *in_RDX = (char)lVar3;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 32-bit or less - lhs signed, rhs unsigned
        std::int64_t tmp = (std::int64_t)lhs + (std::int64_t)rhs;

        if( tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }